

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O0

void __thiscall
wallet::DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
          (DescriptorScriptPubKeyMan *this,WalletStorage *storage,int64_t keypool_size)

{
  long lVar1;
  _func_int **in_RDX;
  WalletStorage *in_RDI;
  long in_FS_OFFSET;
  map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
  *in_stack_ffffffffffffff98;
  WalletDescriptor *this_00;
  ScriptPubKeyMan *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ScriptPubKeyMan::ScriptPubKeyMan(in_stack_ffffffffffffffd0,in_RDI);
  in_RDI->_vptr_WalletStorage = (_func_int **)&PTR__DescriptorScriptPubKeyMan_016155b8;
  std::map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>::map
            ((map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
              *)in_stack_ffffffffffffff98);
  std::map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>::map
            ((map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
              *)in_stack_ffffffffffffff98);
  *(undefined4 *)&in_RDI[0x17]._vptr_WalletStorage = 0xffffffff;
  std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::map
            ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              *)in_stack_ffffffffffffff98);
  this_00 = (WalletDescriptor *)(in_RDI + 0x1e);
  std::
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::map((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
         *)in_stack_ffffffffffffff98);
  *(undefined1 *)&in_RDI[0x24]._vptr_WalletStorage = 0;
  in_RDI[0x25]._vptr_WalletStorage = in_RDX;
  std::
  map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
  ::map(in_stack_ffffffffffffff98);
  WalletDescriptor::WalletDescriptor(this_00);
  AnnotatedMixin<std::recursive_mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DescriptorScriptPubKeyMan(WalletStorage& storage, int64_t keypool_size)
        :   ScriptPubKeyMan(storage),
            m_keypool_size(keypool_size)
        {}